

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

PLTerm __thiscall
mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm
          (BasicExprFactory<std::allocator<char>_> *this,PLTermBuilder builder,Reference arg)

{
  PLTerm PVar1;
  undefined8 in_RCX;
  long in_RSI;
  Impl *impl;
  Impl *in_stack_ffffffffffffffc8;
  
  *(undefined8 *)(in_RSI + 8) = in_RCX;
  PVar1 = internal::ExprBase::Create<mp::PLTerm>(in_stack_ffffffffffffffc8);
  return (BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>)
         PVar1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_;
}

Assistant:

PLTerm EndPLTerm(PLTermBuilder builder, Reference arg) {
    PLTerm::Impl *impl = builder.impl_;
    /// Check that all slopes and breakpoints provided.
    MP_ASSERT(builder.slope_index_ == impl->num_breakpoints + 1,
              "too few slopes");
    MP_ASSERT(builder.breakpoint_index_ == impl->num_breakpoints,
              "too few breakpoints");
    MP_ASSERT(arg != 0, "invalid argument");
    impl->arg = arg.impl_;
    return Expr::Create<PLTerm>(impl);
  }